

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_10,_6>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int row_1;
  Vector<float,_4> *pVVar1;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  undefined1 auVar8 [16];
  bool bVar10;
  undefined4 uVar11;
  Mat2x3 m;
  Vector<float,_3> res;
  Type in0;
  Matrix<float,_3,_2> local_b8;
  float local_a0 [4];
  float local_90 [6];
  float local_78 [4];
  Matrix<float,_4,_3> local_68;
  Matrix<float,_4,_2> local_30;
  long lVar9;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pVVar1 = local_68.m_data.m_data + 1;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      auVar8 = _DAT_019fcc00;
      do {
        bVar10 = SUB164(auVar8 ^ _DAT_019f5ce0,4) == -0x80000000 &&
                 SUB164(auVar8 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
        if (bVar10) {
          uVar11 = 0x3f800000;
          if (lVar3 != lVar6) {
            uVar11 = 0;
          }
          *(undefined4 *)
           ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar1 + -1))->m_data[0].m_data + lVar6) =
               uVar11;
        }
        if (bVar10) {
          uVar11 = 0x3f800000;
          if (lVar3 + -0x10 != lVar6) {
            uVar11 = 0;
          }
          *(undefined4 *)((long)pVVar1->m_data + lVar6) = uVar11;
        }
        lVar9 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar9 + 2;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0x40);
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x10;
      pVVar1 = (Vector<float,_4> *)(pVVar1->m_data + 1);
    } while (lVar5 != 4);
    local_68.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_68.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_68.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_68.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_68.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_68.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    pfVar2 = (float *)&local_68;
    local_68.m_data.m_data[2].m_data[0] = 0.0;
    local_68.m_data.m_data[2].m_data[1] = 0.0;
    local_68.m_data.m_data[2].m_data[2] = 0.0;
    local_68.m_data.m_data[2].m_data[3] = 0.0;
    local_68.m_data.m_data[1].m_data[0] = 0.0;
    local_68.m_data.m_data[1].m_data[1] = 0.0;
    local_68.m_data.m_data[1].m_data[2] = 0.0;
    local_68.m_data.m_data[1].m_data[3] = 0.0;
    local_68.m_data.m_data[0].m_data[0] = 0.0;
    local_68.m_data.m_data[0].m_data[1] = 0.0;
    local_68.m_data.m_data[0].m_data[2] = 0.0;
    local_68.m_data.m_data[0].m_data[3] = 0.0;
    puVar4 = &s_constInMat3x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5] = (float)*(undefined4 *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 3;
    } while (lVar3 != 4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    do {
      fVar7 = 1.0;
      if (lVar3 != 0) {
        fVar7 = 0.0;
      }
      local_b8.m_data.m_data[0].m_data[lVar3] = fVar7;
      fVar7 = 1.0;
      if (lVar3 != 1) {
        fVar7 = 0.0;
      }
      local_a0[lVar3 + -3] = fVar7;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_b8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_b8.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_b8.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_b8.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  }
  else {
    local_b8.m_data.m_data[0].m_data[0] = 0.0;
    local_b8.m_data.m_data[0].m_data[1] = 0.0;
    local_b8.m_data.m_data[0].m_data[2] = 0.0;
    local_b8.m_data.m_data[1].m_data[0] = 0.0;
    local_b8.m_data.m_data[1].m_data[1] = 0.0;
    local_b8.m_data.m_data[1].m_data[2] = 0.0;
    lVar3 = 0;
    do {
      fVar7 = (float)(&DAT_01bf44bc)[lVar3 * 2];
      local_b8.m_data.m_data[0].m_data[lVar3] = (float)(&DAT_01bf44b8)[lVar3 * 2];
      local_a0[lVar3 + -3] = fVar7;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
  }
  tcu::operator*(&local_30,&local_68,&local_b8);
  local_90[0] = local_30.m_data.m_data[0].m_data[0];
  local_90[1] = local_30.m_data.m_data[0].m_data[1];
  local_90[2] = local_30.m_data.m_data[0].m_data[2];
  local_78[0] = local_30.m_data.m_data[1].m_data[1];
  local_78[1] = local_30.m_data.m_data[1].m_data[2];
  local_78[2] = local_30.m_data.m_data[1].m_data[3];
  local_a0[0] = 0.0;
  local_a0[1] = 0.0;
  local_a0[2] = 0.0;
  lVar3 = 0;
  do {
    local_a0[lVar3] = local_90[lVar3] + local_78[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_90[2] = 0.0;
  local_90[3] = 1.4013e-45;
  local_90[4] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_90[lVar3]] = local_a0[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}